

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3StringAppend(StrBuffer *pStr,char *zAppend,int nAppend)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  char *zNew;
  int nAlloc;
  void *in_stack_ffffffffffffffd8;
  int local_1c;
  
  local_1c = in_EDX;
  if (in_EDX < 0) {
    sVar2 = strlen(in_RSI);
    local_1c = (int)sVar2;
  }
  if (*(int *)((long)in_RDI + 0xc) <= (int)in_RDI[1] + local_1c + 1) {
    iVar1 = *(int *)((long)in_RDI + 0xc);
    pvVar3 = sqlite3_realloc(in_stack_ffffffffffffffd8,0);
    if (pvVar3 == (void *)0x0) {
      return 7;
    }
    *in_RDI = (long)pvVar3;
    *(int *)((long)in_RDI + 0xc) = iVar1 + local_1c + 100;
  }
  memcpy((void *)(*in_RDI + (long)(int)in_RDI[1]),in_RSI,(long)local_1c);
  *(int *)(in_RDI + 1) = local_1c + (int)in_RDI[1];
  *(undefined1 *)(*in_RDI + (long)(int)in_RDI[1]) = 0;
  return 0;
}

Assistant:

static int fts3StringAppend(
  StrBuffer *pStr,                /* Buffer to append to */
  const char *zAppend,            /* Pointer to data to append to buffer */
  int nAppend                     /* Size of zAppend in bytes (or -1) */
){
  if( nAppend<0 ){
    nAppend = (int)strlen(zAppend);
  }

  /* If there is insufficient space allocated at StrBuffer.z, use realloc()
  ** to grow the buffer until so that it is big enough to accomadate the
  ** appended data.
  */
  if( pStr->n+nAppend+1>=pStr->nAlloc ){
    int nAlloc = pStr->nAlloc+nAppend+100;
    char *zNew = sqlite3_realloc(pStr->z, nAlloc);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pStr->z = zNew;
    pStr->nAlloc = nAlloc;
  }
  assert( pStr->z!=0 && (pStr->nAlloc >= pStr->n+nAppend+1) );

  /* Append the data to the string buffer. */
  memcpy(&pStr->z[pStr->n], zAppend, nAppend);
  pStr->n += nAppend;
  pStr->z[pStr->n] = '\0';

  return SQLITE_OK;
}